

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

bool __thiscall cmCTestLaunch::ParseArguments(cmCTestLaunch *this,int argc,char **argv)

{
  string *psVar1;
  int iVar2;
  char *__s1;
  char *pcVar3;
  int iVar4;
  cmCTestLaunch *pcVar5;
  long lVar6;
  ulong uVar7;
  undefined4 uVar8;
  bool bVar9;
  char *local_38;
  
  if (1 < argc) {
    psVar1 = &this->OptionLanguage;
    uVar8 = 0;
    uVar7 = 2;
    do {
      __s1 = argv[uVar7 - 1];
      if (((*__s1 == '-') && (__s1[1] == '-')) && (__s1[2] == '\0')) {
        iVar4 = (int)uVar7;
        goto switchD_0018bf1a_caseD_7;
      }
      iVar2 = strcmp(__s1,"--output");
      iVar4 = 0;
      if (iVar2 == 0) {
        uVar8 = 1;
        goto switchD_0018bf1a_caseD_7;
      }
      iVar2 = strcmp(__s1,"--source");
      if (iVar2 == 0) {
        uVar8 = 2;
        goto switchD_0018bf1a_caseD_7;
      }
      iVar2 = strcmp(__s1,"--language");
      if (iVar2 == 0) {
        uVar8 = 3;
        goto switchD_0018bf1a_caseD_7;
      }
      iVar2 = strcmp(__s1,"--target-name");
      if (iVar2 == 0) {
        uVar8 = 4;
        goto switchD_0018bf1a_caseD_7;
      }
      iVar2 = strcmp(__s1,"--target-type");
      if (iVar2 == 0) {
        uVar8 = 5;
        goto switchD_0018bf1a_caseD_7;
      }
      iVar2 = strcmp(__s1,"--build-dir");
      if (iVar2 == 0) {
        uVar8 = 6;
        goto switchD_0018bf1a_caseD_7;
      }
      iVar2 = strcmp(__s1,"--filter-prefix");
      if (iVar2 == 0) {
        uVar8 = 8;
        goto switchD_0018bf1a_caseD_7;
      }
      switch(uVar8) {
      case 1:
        pcVar3 = (char *)(this->OptionOutput)._M_string_length;
        strlen(__s1);
        pcVar5 = this;
        break;
      case 2:
        pcVar3 = (char *)(this->OptionSource)._M_string_length;
        strlen(__s1);
        pcVar5 = (cmCTestLaunch *)&this->OptionSource;
        break;
      case 3:
        pcVar3 = (char *)(this->OptionLanguage)._M_string_length;
        strlen(__s1);
        uVar8 = 0;
        std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar3,(ulong)__s1);
        iVar2 = std::__cxx11::string::compare((char *)psVar1);
        iVar4 = 0;
        if (iVar2 == 0) {
          pcVar3 = (char *)(this->OptionLanguage)._M_string_length;
          __s1 = "C++";
          pcVar5 = (cmCTestLaunch *)psVar1;
          break;
        }
        goto switchD_0018bf1a_caseD_7;
      case 4:
        pcVar3 = (char *)(this->OptionTargetName)._M_string_length;
        strlen(__s1);
        pcVar5 = (cmCTestLaunch *)&this->OptionTargetName;
        break;
      case 5:
        pcVar3 = (char *)(this->OptionTargetType)._M_string_length;
        strlen(__s1);
        pcVar5 = (cmCTestLaunch *)&this->OptionTargetType;
        break;
      case 6:
        pcVar3 = (char *)(this->OptionBuildDir)._M_string_length;
        strlen(__s1);
        pcVar5 = (cmCTestLaunch *)&this->OptionBuildDir;
        break;
      default:
        goto switchD_0018bf1a_caseD_7;
      case 8:
        pcVar3 = (char *)(this->OptionFilterPrefix)._M_string_length;
        strlen(__s1);
        pcVar5 = (cmCTestLaunch *)&this->OptionFilterPrefix;
      }
      uVar8 = 0;
      std::__cxx11::string::_M_replace((ulong)pcVar5,0,pcVar3,(ulong)__s1);
      iVar4 = 0;
switchD_0018bf1a_caseD_7:
    } while ((iVar4 == 0) && (bVar9 = uVar7 < (uint)argc, uVar7 = uVar7 + 1, bVar9));
    if (iVar4 != 0) {
      this->RealArgC = argc - iVar4;
      this->RealArgV = argv + iVar4;
      if (argc - iVar4 != 0 && iVar4 <= argc) {
        lVar6 = 0;
        do {
          local_38 = this->RealArgV[lVar6];
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->RealArgs,&local_38);
          lVar6 = lVar6 + 1;
        } while (lVar6 < this->RealArgC);
        return iVar4 != 0;
      }
      return true;
    }
  }
  this->RealArgC = 0;
  this->RealArgV = (char **)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"No launch/command separator (\'--\') found!\n",0x2a);
  return false;
}

Assistant:

bool cmCTestLaunch::ParseArguments(int argc, const char* const* argv)
{
  // Launcher options occur first and are separated from the real
  // command line by a '--' option.
  enum Doing
  {
    DoingNone,
    DoingOutput,
    DoingSource,
    DoingLanguage,
    DoingTargetName,
    DoingTargetType,
    DoingBuildDir,
    DoingCount,
    DoingFilterPrefix
  };
  Doing doing = DoingNone;
  int arg0 = 0;
  for (int i = 1; !arg0 && i < argc; ++i) {
    const char* arg = argv[i];
    if (strcmp(arg, "--") == 0) {
      arg0 = i + 1;
    } else if (strcmp(arg, "--output") == 0) {
      doing = DoingOutput;
    } else if (strcmp(arg, "--source") == 0) {
      doing = DoingSource;
    } else if (strcmp(arg, "--language") == 0) {
      doing = DoingLanguage;
    } else if (strcmp(arg, "--target-name") == 0) {
      doing = DoingTargetName;
    } else if (strcmp(arg, "--target-type") == 0) {
      doing = DoingTargetType;
    } else if (strcmp(arg, "--build-dir") == 0) {
      doing = DoingBuildDir;
    } else if (strcmp(arg, "--filter-prefix") == 0) {
      doing = DoingFilterPrefix;
    } else if (doing == DoingOutput) {
      this->OptionOutput = arg;
      doing = DoingNone;
    } else if (doing == DoingSource) {
      this->OptionSource = arg;
      doing = DoingNone;
    } else if (doing == DoingLanguage) {
      this->OptionLanguage = arg;
      if (this->OptionLanguage == "CXX") {
        this->OptionLanguage = "C++";
      }
      doing = DoingNone;
    } else if (doing == DoingTargetName) {
      this->OptionTargetName = arg;
      doing = DoingNone;
    } else if (doing == DoingTargetType) {
      this->OptionTargetType = arg;
      doing = DoingNone;
    } else if (doing == DoingBuildDir) {
      this->OptionBuildDir = arg;
      doing = DoingNone;
    } else if (doing == DoingFilterPrefix) {
      this->OptionFilterPrefix = arg;
      doing = DoingNone;
    }
  }

  // Extract the real command line.
  if (arg0) {
    this->RealArgC = argc - arg0;
    this->RealArgV = argv + arg0;
    for (int i = 0; i < this->RealArgC; ++i) {
      this->HandleRealArg(this->RealArgV[i]);
    }
    return true;
  }
  this->RealArgC = 0;
  this->RealArgV = nullptr;
  std::cerr << "No launch/command separator ('--') found!\n";
  return false;
}